

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O2

void add_radial_scalar(FmsDataCollection dc,FmsComponent volume,char *name,int order,int *dims,
                      double *verts,int nverts,int *edges,int nedges,int *faces,int nfaces,
                      int ncells)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *dest;
  double *pdVar4;
  void *data;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  FmsFieldDescriptor fd;
  FmsMetaData mdata;
  FmsField f;
  char fdname [100];
  
  uVar6 = 0;
  sprintf(fdname,"%s descriptor");
  FmsDataCollectionAddFieldDescriptor(dc,fdname,&fd);
  FmsFieldDescriptorSetComponent(fd,volume);
  FmsFieldDescriptorSetFixedOrder(fd,FMS_CONTINUOUS,FMS_NODAL_GAUSS_CLOSED,(long)order);
  iVar3 = order + -1;
  uVar5 = ((ncells * iVar3 + nfaces) * iVar3 + nedges) * iVar3 + nverts;
  lVar7 = (long)(int)uVar5;
  dest = (double *)malloc(lVar7 * 0x18);
  pdVar4 = append_coord_dofs_verts(dest,verts,nverts,0);
  pdVar4 = append_coord_dofs_edge(order,pdVar4,verts,edges,nedges,0.0,0);
  pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,0);
  append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,0);
  pdVar4 = append_coord_dofs_verts(dest + lVar7,verts,nverts,1);
  pdVar4 = append_coord_dofs_edge(order,pdVar4,verts,edges,nedges,0.0,1);
  pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,1);
  append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,1);
  pdVar4 = append_coord_dofs_verts(dest + (int)(uVar5 * 2),verts,nverts,2);
  pdVar4 = append_coord_dofs_edge(order,pdVar4,verts,edges,nedges,0.0,2);
  pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,2);
  append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,2);
  data = malloc(lVar7 * 8);
  uVar8 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar8 = uVar6;
  }
  for (; uVar8 * 8 != uVar6; uVar6 = uVar6 + 8) {
    dVar1 = *(double *)((long)(dest + lVar7) + uVar6);
    dVar2 = *(double *)((long)(dest + (int)(uVar5 * 2)) + uVar6);
    *(double *)((long)data + uVar6) =
         SQRT(dVar2 * dVar2 +
              *(double *)((long)dest + uVar6) * *(double *)((long)dest + uVar6) + dVar1 * dVar1);
  }
  FmsDataCollectionAddField(dc,name,&f);
  FmsFieldSet(f,fd,1,FMS_BY_VDIM,FMS_DOUBLE,data);
  FmsFieldAttachMetaData(f,&mdata);
  FmsMetaDataSetString(mdata,"units","cm");
  free(data);
  free(dest);
  return;
}

Assistant:

void
add_radial_scalar(FmsDataCollection dc, FmsComponent volume,
                  const char *name, int order, const int *dims,
                  const double *verts, int nverts,
                  const int *edges, int nedges,
                  const int *faces, int nfaces,
                  int ncells) {
  int i, ndofs;
  double *data, *coords, *x, *y, *z;
  char fdname[100];

  /* Create a field descriptor for the coordinates that live on "surface". */
  sprintf(fdname, "%s descriptor", name);
  FmsFieldDescriptor fd;
  FmsDataCollectionAddFieldDescriptor(dc, fdname, &fd);
  FmsFieldDescriptorSetComponent(fd, volume);
  FmsFieldDescriptorSetFixedOrder(fd, FMS_CONTINUOUS,
                                  FMS_NODAL_GAUSS_CLOSED, order);

  /* First, make coordinates of the target order. */
  ndofs = dofs_for_order(order, nverts, nedges, nfaces, ncells);

  /* Make the coordinate data. Make it BYNODE xxxx...yyyy...zzzz... */
  coords = (double *)malloc(ndofs * sizeof(double)*3);
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;

  /* Store coordinate dofs by node. */
  x = append_coord_dofs_verts(x, verts, nverts, 0);
  x = append_coord_dofs_edge(order, x, verts, edges, nedges, 0., 0);
  x = append_coord_dofs_face(order, x, verts, edges, faces, nfaces, 0., 0);
  x = append_coord_dofs_cell(order, x, dims, verts, 0., 0);

  y = append_coord_dofs_verts(y, verts, nverts, 1);
  y = append_coord_dofs_edge(order, y, verts, edges, nedges, 0., 1);
  y = append_coord_dofs_face(order, y, verts, edges, faces, nfaces, 0., 1);
  y = append_coord_dofs_cell(order, y, dims, verts, 0., 1);

  z = append_coord_dofs_verts(z, verts, nverts, 2);
  z = append_coord_dofs_edge(order, z, verts, edges, nedges, 0., 2);
  z = append_coord_dofs_face(order, z, verts, edges, faces, nfaces, 0., 2);
  z = append_coord_dofs_cell(order, z, dims, verts, 0., 2);

  /* Make the radial data. */
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;
  data = (double *)malloc(ndofs * sizeof(double));
  for(i = 0; i < ndofs; ++i) {
    data[i] = sqrt(x[i]*x[i] + y[i]*y[i] + z[i]*z[i]);
  }

#if 0
  /* Write coordinate dofs as Point3D so we can plot them. */
  char tmp[100];
  sprintf(tmp, "%s.3D", name);
  FILE *fp = fopen(tmp, "wt");
  fprintf(fp, "X Y Z dof\n");
  for(i = 0; i < ndofs; ++i)
    fprintf(fp, "%lg %lg 0. %f\n", coords[i*2],coords[i*2+1], data[i]);
  fclose(fp);
#endif

  /* Add the coordinates to the data collection. */
  FmsField f;
  FmsDataCollectionAddField(dc, name, &f);
  FmsFieldSet(f, fd, 1, FMS_BY_VDIM, FMS_DOUBLE, data);

  /* Add some field metadata. (optional) */
  FmsMetaData mdata;
  FmsFieldAttachMetaData(f, &mdata);
  FmsMetaDataSetString(mdata, "units", "cm");

  free(data);
  free(coords);
}